

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  char cVar1;
  ptls_key_schedule_t *ppVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 in_RAX;
  uint8_t *puVar10;
  ptls_message_emitter_t *emitter_00;
  size_t sVar11;
  ptls_hash_context_t **pppVar12;
  ptls_iovec_t message_00;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  puVar10 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  if (7 < tls->state - PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO) {
switchD_0011001a_caseD_e:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x121c,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar1 = *(char *)&emitter_00->buf;
  message_00.len._1_7_ = message.len._1_7_;
  message_00.len._0_1_ = cVar1;
  switch(tls->state) {
  default:
    iVar9 = 0x28;
    if (is_end_of_record != 0 && cVar1 == '\x01') {
      iVar9 = server_handle_hello(tls,emitter,message,properties);
      return iVar9;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (cVar1 != '\v') {
      return 10;
    }
    iVar9 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                               puVar10 + (long)&emitter_00->buf,&local_34);
    if (iVar9 != 0) {
      return iVar9;
    }
    if (local_34 == 0) {
      return 0x74;
    }
    ppVar2 = tls->key_schedule;
    if (ppVar2->num_hashes != 0) {
      pppVar12 = &ppVar2->hashes[0].ctx;
      sVar11 = 0;
      do {
        (*(*pppVar12)->update)(*pppVar12,emitter_00,(size_t)puVar10);
        sVar11 = sVar11 + 1;
        pppVar12 = pppVar12 + 2;
      } while (sVar11 != ppVar2->num_hashes);
    }
    tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
    goto LAB_00110233;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (cVar1 != '\x0f') {
      return 10;
    }
    iVar9 = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
    if (iVar9 != 0) {
      return iVar9;
    }
    goto LAB_0011022c;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0x70 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x1203,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (cVar1 != '\x05') {
      return 10;
    }
    iVar9 = commission_handshake_secret(tls);
    if (iVar9 != 0) {
      return iVar9;
    }
    ppVar2 = tls->key_schedule;
    if (ppVar2->num_hashes != 0) {
      pppVar12 = &ppVar2->hashes[0].ctx;
      sVar11 = 0;
      do {
        (*(*pppVar12)->update)(*pppVar12,emitter_00,(size_t)puVar10);
        sVar11 = sVar11 + 1;
        pppVar12 = pppVar12 + 2;
      } while (sVar11 != ppVar2->num_hashes);
    }
LAB_0011022c:
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
LAB_00110233:
    iVar9 = 0x202;
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    iVar9 = 0x28;
    if ((is_end_of_record != 0 && cVar1 == '\x14') &&
       (iVar9 = verify_finished(tls,message), iVar9 == 0)) {
      puVar3 = (tls->field_18).client.legacy_session_id.base;
      sVar11 = (tls->field_18).client.legacy_session_id.len;
      uVar4 = *(undefined8 *)((long)&tls->field_18 + 0x10);
      uVar5 = *(undefined8 *)((long)&tls->field_18 + 0x18);
      uVar6 = *(undefined8 *)((long)&tls->field_18 + 0x20);
      uVar7 = *(undefined8 *)((long)&tls->field_18 + 0x28);
      uVar8 = *(undefined8 *)((long)&tls->field_18 + 0x38);
      *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x30) =
           (tls->field_18).client.key_share_ctx;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar8;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x20) = uVar6;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar7;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar4;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar5;
      *(uint8_t **)(tls->traffic_protection).dec.secret = puVar3;
      *(size_t *)((tls->traffic_protection).dec.secret + 8) = sVar11;
      (*ptls_clear_memory)(&tls->field_18,0x40);
      iVar9 = setup_traffic_protection(tls,0,(char *)0x0,3,0);
      if (iVar9 == 0) {
        ppVar2 = tls->key_schedule;
        if (ppVar2->num_hashes != 0) {
          pppVar12 = &ppVar2->hashes[0].ctx;
          sVar11 = 0;
          do {
            (*(*pppVar12)->update)(*pppVar12,emitter_00,(size_t)puVar10);
            sVar11 = sVar11 + 1;
            pppVar12 = pppVar12 + 2;
          } while (sVar11 != ppVar2->num_hashes);
        }
        tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
        iVar9 = 0;
      }
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    goto switchD_0011001a_caseD_e;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    iVar9 = 10;
    if (cVar1 == '\x18') {
      message_00.base = puVar10;
      iVar9 = handle_key_update(tls,emitter_00,message_00);
      return iVar9;
    }
  }
  return iVar9;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}